

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Extractor::input(Extractor *this,int blob_index,Mat *in)

{
  pointer pMVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Mat *pMVar6;
  
  iVar5 = -1;
  if ((-1 < blob_index) &&
     (pMVar1 = (this->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start,
     blob_index <
     (int)((ulong)((long)(this->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1) >> 6))) {
    pMVar6 = pMVar1 + (uint)blob_index;
    iVar5 = 0;
    if (pMVar6 != in) {
      piVar2 = in->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = pMVar6->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (pMVar6->allocator == (Allocator *)0x0) {
            if (pMVar6->data != (void *)0x0) {
              free(pMVar6->data);
            }
          }
          else {
            (*pMVar6->allocator->_vptr_Allocator[3])();
          }
        }
      }
      *(undefined8 *)((long)&pMVar6->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar6->elemsize + 4) = 0;
      pMVar6->data = (void *)0x0;
      pMVar6->refcount = (int *)0x0;
      pMVar6->dims = 0;
      pMVar6->w = 0;
      pMVar6->h = 0;
      pMVar6->c = 0;
      pMVar6->cstep = 0;
      piVar2 = in->refcount;
      pMVar6->data = in->data;
      pMVar6->refcount = piVar2;
      pMVar6->elemsize = in->elemsize;
      pMVar6->packing = in->packing;
      pMVar6->allocator = in->allocator;
      iVar5 = in->w;
      iVar3 = in->h;
      iVar4 = in->c;
      pMVar6->dims = in->dims;
      pMVar6->w = iVar5;
      pMVar6->h = iVar3;
      pMVar6->c = iVar4;
      pMVar6->cstep = in->cstep;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int Extractor::input(int blob_index, const Mat& in)
{
    if (blob_index < 0 || blob_index >= (int)blob_mats.size())
        return -1;

    blob_mats[blob_index] = in;

    return 0;
}